

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_1adff5::Db::parseNewExpr(Db *this)

{
  char cVar1;
  Node **ppNVar2;
  Node **ppNVar3;
  Node *pNVar4;
  Node *pNVar5;
  short *psVar6;
  short *psVar7;
  size_t sVar8;
  Kind KVar9;
  NodeArray NVar10;
  Node *Ex;
  Node *local_50;
  Node **local_48;
  size_t local_40;
  size_t local_38;
  
  psVar6 = (short *)this->First;
  psVar7 = (short *)this->Last;
  if ((ulong)((long)psVar7 - (long)psVar6) < 2) {
    return (Node *)0x0;
  }
  if (*psVar6 == 0x7367) {
    psVar6 = psVar6 + 1;
    this->First = (char *)psVar6;
    KVar9 = KDotSuffix;
    if ((ulong)((long)psVar7 - (long)psVar6) < 2) {
      return (Node *)0x0;
    }
  }
  else {
    KVar9 = KNodeArrayNode;
  }
  cVar1 = *(char *)((long)psVar6 + 1);
  if ((*psVar6 == 0x776e) || (*psVar6 == 0x616e)) {
    psVar6 = psVar6 + 1;
    this->First = (char *)psVar6;
    ppNVar2 = (this->Names).Last;
    ppNVar3 = (this->Names).First;
    while ((psVar6 == psVar7 || ((char)*psVar6 != '_'))) {
      local_50 = parseExpr(this);
      if (local_50 == (Node *)0x0) {
        return (Node *)0x0;
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_50);
      psVar7 = (short *)this->Last;
      psVar6 = (short *)this->First;
    }
    this->First = (char *)((long)psVar6 + 1);
    NVar10 = popTrailingNodeArray(this,(long)ppNVar2 - (long)ppNVar3 >> 3);
    sVar8 = NVar10.NumElements;
    local_48 = NVar10.Elements;
    pNVar4 = parseType(this);
    if (pNVar4 != (Node *)0x0) {
      psVar6 = (short *)this->First;
      psVar7 = (short *)this->Last;
      if (((ulong)((long)psVar7 - (long)psVar6) < 2) || (*psVar6 != 0x6970)) {
        if (psVar6 == psVar7) {
          return (Node *)0x0;
        }
        if ((char)*psVar6 != 'E') {
          return (Node *)0x0;
        }
        this->First = (char *)((long)psVar6 + 1);
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x40);
        pNVar5->K = KExpr;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00187118;
        pNVar5[1]._vptr_Node = (_func_int **)local_48;
        pNVar5[1].K = (char)sVar8;
        pNVar5[1].RHSComponentCache = (char)(sVar8 >> 8);
        pNVar5[1].ArrayCache = (char)(sVar8 >> 0x10);
        pNVar5[1].FunctionCache = (char)(sVar8 >> 0x18);
        *(int *)&pNVar5[1].field_0xc = (int)(sVar8 >> 0x20);
        pNVar5[2]._vptr_Node = (_func_int **)pNVar4;
        pNVar5[2].K = KNodeArrayNode;
        pNVar5[2].RHSComponentCache = Yes;
        pNVar5[2].ArrayCache = Yes;
        pNVar5[2].FunctionCache = Yes;
        *(undefined4 *)&pNVar5[2].field_0xc = 0;
        pNVar5[3]._vptr_Node = (_func_int **)0x0;
      }
      else {
        psVar6 = psVar6 + 1;
        this->First = (char *)psVar6;
        local_40 = (long)(this->Names).Last - (long)(this->Names).First >> 3;
        local_38 = sVar8;
        while ((psVar6 == psVar7 || ((char)*psVar6 != 'E'))) {
          local_50 = parseExpr(this);
          if (local_50 == (Node *)0x0) {
            return (Node *)0x0;
          }
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_50);
          psVar7 = (short *)this->Last;
          psVar6 = (short *)this->First;
        }
        this->First = (char *)((long)psVar6 + 1);
        NVar10 = popTrailingNodeArray(this,local_40);
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x40);
        pNVar5->K = KExpr;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00187118;
        pNVar5[1]._vptr_Node = (_func_int **)local_48;
        pNVar5[1].K = (undefined1)local_38;
        pNVar5[1].RHSComponentCache = local_38._1_1_;
        pNVar5[1].ArrayCache = local_38._2_1_;
        pNVar5[1].FunctionCache = local_38._3_1_;
        *(undefined4 *)&pNVar5[1].field_0xc = local_38._4_4_;
        pNVar5[2]._vptr_Node = (_func_int **)pNVar4;
        *(NodeArray *)&pNVar5[2].K = NVar10;
      }
      pNVar5[3].K = KVar9;
      pNVar5[3].RHSComponentCache = cVar1 == 'a';
      return pNVar5;
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(StringView S) {
    if (StringView(First, Last).startsWith(S)) {
      First += S.size();
      return true;
    }
    return false;
  }